

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::format_uint<4u,char,unsigned_int>
                 (char *buffer,uint value,uint num_digits,bool upper)

{
  char *local_40;
  uint digit;
  char *digits;
  char *end;
  uint uStack_14;
  bool upper_local;
  uint num_digits_local;
  uint value_local;
  char *buffer_local;
  
  uStack_14 = value;
  _num_digits_local = buffer + num_digits;
  do {
    if (upper) {
      local_40 = "0123456789ABCDEF";
    }
    else {
      local_40 = "0123456789abcdef";
    }
    _num_digits_local[-1] = local_40[uStack_14 & 0xf];
    uStack_14 = uStack_14 >> 4;
    _num_digits_local = _num_digits_local + -1;
  } while (uStack_14 != 0);
  return buffer + num_digits;
}

Assistant:

inline Char *format_uint(Char *buffer, UInt value, unsigned num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char *end = buffer;
  do {
    const char *digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = BASE_BITS < 4 ? static_cast<char>('0' + digit) : digits[digit];
  } while ((value >>= BASE_BITS) != 0);
  return end;
}